

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Value::dupPayload(Value *this,Value *other)

{
  undefined1 *puVar1;
  uint *puVar2;
  byte bVar3;
  _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  char *pcVar4;
  
  bVar3 = (byte)*(ushort *)&other->bits_;
  *(ushort *)&this->bits_ = SUB42(this->bits_,0) & 0xfe00 | *(ushort *)&other->bits_ & 0xff;
  if (bVar3 < 8) {
    if ((0x2fU >> (bVar3 & 0x1f) & 1) == 0) {
      if ((0xc0U >> (bVar3 & 0x1f) & 1) == 0) {
        puVar2 = (uint *)(other->value_).string_;
        if ((puVar2 == (uint *)0x0) || (((other->bits_).field_0x1 & 1) == 0)) {
          (this->value_).string_ = (char *)puVar2;
        }
        else {
          pcVar4 = duplicateAndPrefixStringValue((char *)(puVar2 + 1),*puVar2);
          (this->value_).string_ = pcVar4;
          puVar1 = &(this->bits_).field_0x1;
          *puVar1 = *puVar1 | 1;
        }
      }
      else {
        this_00 = (_Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                   *)operator_new(0x30);
        std::
        _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
        ::_Rb_tree(this_00,&((other->value_).map_)->_M_t);
        (this->value_).map_ = (ObjectValues *)this_00;
      }
    }
    else {
      this->value_ = other->value_;
    }
    return;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/external/jsoncpp/src/lib_json/json_value.cpp"
                ,0x3ec,"void Json::Value::dupPayload(const Value &)");
}

Assistant:

ValueType Value::type() const {
  return static_cast<ValueType>(bits_.value_type_);
}